

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
FxMemberIdentifier::FxMemberIdentifier
          (FxMemberIdentifier *this,FxExpression *left,FName *name,FScriptPosition *pos)

{
  FName local_2c;
  FScriptPosition *local_28;
  FScriptPosition *pos_local;
  FName *name_local;
  FxExpression *left_local;
  FxMemberIdentifier *this_local;
  
  local_28 = pos;
  pos_local = (FScriptPosition *)name;
  name_local = (FName *)left;
  left_local = (FxExpression *)this;
  FName::FName(&local_2c,name);
  FxIdentifier::FxIdentifier(&this->super_FxIdentifier,&local_2c,local_28);
  (this->super_FxIdentifier).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxMemberIdentifier_00a0ac68;
  this->Object = (FxExpression *)name_local;
  (this->super_FxIdentifier).super_FxExpression.ExprType = EFX_MemberIdentifier;
  return;
}

Assistant:

FxMemberIdentifier::FxMemberIdentifier(FxExpression *left, FName name, const FScriptPosition &pos)
	: FxIdentifier(name, pos)
{
	Object = left;
	ExprType = EFX_MemberIdentifier;
}